

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS
ref_fixture_hex_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_GRID_conflict pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  REF_DBL RVar11;
  REF_NODE pRVar12;
  undefined4 in_register_00000084;
  int iVar13;
  int iVar14;
  ulong uVar15;
  REF_INT RVar16;
  uint uVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  REF_INT quad [5];
  REF_INT hex [8];
  REF_INT cell;
  REF_INT node;
  uint local_11c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined4 local_f8;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  REF_INT local_c4;
  ulong local_c0;
  undefined8 local_b8;
  double local_b0;
  double local_a8;
  uint local_9c;
  REF_GRID_conflict local_98;
  double local_90;
  REF_DBL local_88;
  REF_DBL local_80;
  ulong local_78;
  double local_70;
  REF_NODE local_68;
  double local_60;
  ulong local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_b8 = CONCAT44(in_register_00000084,n);
  uVar15 = (ulong)(uint)m;
  uVar3 = 0;
  if (0 < l0) {
    uVar3 = l0;
  }
  uVar17 = l - 1;
  if ((int)uVar17 <= (int)uVar3) {
    uVar3 = uVar17;
  }
  uVar10 = (ulong)uVar3;
  local_b0 = x0;
  local_a8 = z1;
  local_90 = y1;
  local_70 = z0;
  local_60 = y0;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x505
           ,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,"create");
    return uVar3;
  }
  pRVar1 = *ref_grid_ptr;
  pRVar12 = pRVar1->node;
  iVar8 = (int)local_b8;
  local_58 = uVar10;
  if (pRVar1->mpi->id == 0) {
    local_78 = (ulong)(m - 1U);
    local_48 = (ulong)(iVar8 - 1U);
    local_c0 = uVar15;
    local_9c = uVar17;
    local_98 = pRVar1;
    local_68 = pRVar12;
    if (0 < iVar8) {
      dVar23 = x1 - local_b0;
      dVar21 = (local_90 - local_60) / (double)(int)(m - 1U);
      dVar19 = (local_a8 - local_70) / (double)(int)(iVar8 - 1U);
      local_40 = (ulong)(uint)(m * l);
      lVar18 = 0;
      iVar8 = 0;
      dVar20 = local_70;
      dVar22 = local_60;
      local_a8 = dVar19;
      local_90 = dVar21;
      do {
        local_50 = iVar8;
        local_38 = lVar18;
        if (0 < (int)uVar15) {
          local_88 = (double)iVar8 * dVar19 + dVar20;
          iVar8 = 0;
          do {
            if (0 < l) {
              local_80 = (double)iVar8 * dVar21 + dVar22;
              uVar15 = 0;
              do {
                uVar3 = ref_node_add(pRVar12,(long)((int)lVar18 + (int)uVar15),&local_4c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                         ,0x514,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,"node");
                  return uVar3;
                }
                pRVar2 = local_68->real;
                lVar6 = (long)local_4c;
                pRVar2[lVar6 * 0xf] =
                     (double)(int)uVar15 * (dVar23 / (double)(int)uVar17) + local_b0;
                pRVar2[lVar6 * 0xf + 1] = local_80;
                pRVar2[lVar6 * 0xf + 2] = local_88;
                uVar15 = uVar15 + 1;
                pRVar12 = local_68;
              } while ((uint)l != uVar15);
            }
            iVar8 = iVar8 + 1;
            lVar18 = lVar18 + (ulong)(uint)l;
            uVar15 = local_c0;
            dVar19 = local_a8;
            dVar20 = local_70;
            dVar21 = local_90;
            dVar22 = local_60;
          } while (iVar8 != (int)local_c0);
        }
        iVar8 = local_50 + 1;
        lVar18 = local_38 + local_40;
      } while (iVar8 != (int)local_b8);
    }
    uVar7 = local_b8;
    if (1 < (int)local_b8) {
      iVar4 = ((int)uVar15 + 1) * l;
      iVar8 = (int)uVar15 * l;
      iVar5 = 1;
      iVar13 = 0;
      local_70 = (double)CONCAT44(local_70._4_4_,iVar8);
      RVar16 = l;
      do {
        local_80 = (REF_DBL)CONCAT44(local_80._4_4_,iVar5);
        local_b0 = (double)CONCAT44(local_b0._4_4_,iVar4);
        local_88 = (REF_DBL)CONCAT44(local_88._4_4_,iVar13);
        local_a8 = (double)CONCAT44(local_a8._4_4_,iVar8);
        local_90 = (double)CONCAT44(local_90._4_4_,RVar16);
        if (1 < (int)uVar15) {
          iVar5 = 1;
          do {
            if (1 < l) {
              uVar3 = 0;
              do {
                local_e8 = iVar13 + uVar3;
                local_e4 = iVar13 + uVar3 + 1;
                local_dc = RVar16 + uVar3;
                local_e0 = RVar16 + 1 + uVar3;
                local_d8 = iVar8 + uVar3;
                local_d4 = iVar8 + 1 + uVar3;
                local_cc = iVar4 + uVar3;
                local_d0 = iVar4 + 1 + uVar3;
                uVar17 = ref_cell_add(local_98->cell[0xb],&local_e8,&local_c4);
                if (uVar17 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                         ,0x528,"ref_fixture_hex_brick_args_grid",(ulong)uVar17,"hex");
                  return uVar17;
                }
                uVar3 = uVar3 + 1;
              } while (local_9c != uVar3);
            }
            iVar5 = iVar5 + 1;
            iVar4 = iVar4 + l;
            RVar16 = RVar16 + l;
            iVar8 = iVar8 + l;
            iVar13 = iVar13 + l;
            uVar7 = local_b8;
          } while (iVar5 != (int)local_c0);
        }
        iVar5 = local_80._0_4_ + 1;
        iVar4 = local_b0._0_4_ + local_70._0_4_;
        RVar16 = local_90._0_4_ + local_70._0_4_;
        iVar8 = local_a8._0_4_ + local_70._0_4_;
        iVar13 = local_88._0_4_ + local_70._0_4_;
        uVar15 = local_c0;
      } while (iVar5 != (int)uVar7);
    }
    local_f8 = 1;
    if (1 < (int)uVar7) {
      iVar4 = ((int)uVar15 + 1) * l;
      iVar5 = (int)uVar15 * l;
      iVar8 = 1;
      iVar13 = 0;
      do {
        uVar10 = local_78 & 0xffffffff;
        iVar14 = iVar13;
        if (1 < (int)uVar15) {
          do {
            local_e4 = iVar14 + 1;
            local_e0 = l + 1 + iVar14;
            local_fc = iVar5 + iVar14;
            local_d4 = iVar5 + 1 + iVar14;
            local_100 = iVar4 + iVar14;
            local_d0 = iVar4 + 1 + iVar14;
            iVar9 = l + iVar14;
            local_108 = iVar14;
            local_104 = iVar9;
            local_e8 = iVar14;
            local_dc = iVar9;
            local_d8 = local_fc;
            local_cc = local_100;
            uVar3 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x534,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,"qua");
              return uVar3;
            }
            uVar3 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar3;
            iVar14 = iVar9;
          } while (uVar3 != 0);
        }
        iVar8 = iVar8 + 1;
        iVar13 = iVar13 + iVar5;
        uVar15 = local_c0;
      } while (iVar8 != (int)local_b8);
    }
    iVar8 = (int)uVar15;
    local_f8 = 2;
    iVar4 = (int)local_b8;
    if (1 < iVar4) {
      iVar5 = 1;
      local_b0 = (double)CONCAT44(local_b0._4_4_,1 - iVar8);
      local_a8 = (double)CONCAT44(local_a8._4_4_,iVar8 * l);
      local_90 = (double)CONCAT44(local_90._4_4_,(iVar8 + 2) * l);
      local_70 = (double)CONCAT44(local_70._4_4_,l * 2);
      local_60 = (double)CONCAT44(local_60._4_4_,(iVar8 + 1) * l);
      RVar11 = 0.0;
      do {
        local_80 = (REF_DBL)CONCAT44(local_80._4_4_,iVar5);
        local_88 = RVar11;
        if (1 < (int)uVar15) {
          iVar8 = SUB84(RVar11,0);
          iVar13 = 0;
          uVar15 = (ulong)local_70 & 0xffffffff;
          iVar4 = local_60._0_4_;
          iVar5 = local_90._0_4_;
          RVar16 = l;
          do {
            local_e8 = iVar8 + RVar16 + -2;
            local_104 = iVar8 + -1 + RVar16;
            iVar14 = (int)uVar15;
            local_108 = iVar8 + -1 + iVar14;
            local_dc = iVar8 + -2 + iVar14;
            local_d8 = iVar8 + -2 + iVar4;
            local_100 = iVar8 + -1 + iVar4;
            local_fc = iVar8 + -1 + iVar5;
            local_cc = iVar8 + -2 + iVar5;
            local_e4 = local_104;
            local_e0 = local_108;
            local_d4 = local_100;
            local_d0 = local_fc;
            uVar3 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x540,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,"qua");
              return uVar3;
            }
            iVar13 = iVar13 + -1;
            iVar5 = iVar5 + l;
            uVar15 = (ulong)(uint)(iVar14 + l);
            iVar4 = iVar4 + l;
            RVar16 = RVar16 + l;
          } while (local_b0._0_4_ != iVar13);
        }
        iVar5 = local_80._0_4_ + 1;
        RVar11 = (REF_DBL)(ulong)(uint)(SUB84(local_88,0) + local_a8._0_4_);
        iVar4 = (int)local_b8;
        iVar8 = (int)local_c0;
        uVar15 = local_c0;
      } while (iVar5 != iVar4);
    }
    local_f8 = 3;
    if (1 < iVar4) {
      iVar5 = iVar8 * l;
      iVar9 = (iVar8 + 1) * l;
      iVar13 = 1;
      iVar14 = 0;
      local_b0 = (double)CONCAT44(local_b0._4_4_,iVar5);
      RVar16 = l;
      do {
        if (1 < l) {
          uVar3 = 0;
          do {
            local_104 = iVar14 + uVar3;
            local_108 = iVar14 + uVar3 + 1;
            local_dc = RVar16 + uVar3;
            local_e0 = RVar16 + 1 + uVar3;
            local_100 = iVar5 + uVar3;
            local_fc = iVar5 + 1 + uVar3;
            local_cc = iVar9 + uVar3;
            local_d0 = iVar9 + 1 + uVar3;
            local_e8 = local_104;
            local_e4 = local_108;
            local_d8 = local_100;
            local_d4 = local_fc;
            uVar17 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
            if (uVar17 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x54c,"ref_fixture_hex_brick_args_grid",(ulong)uVar17,"qua");
              return uVar17;
            }
            uVar3 = uVar3 + 1;
          } while (local_9c != uVar3);
        }
        iVar13 = iVar13 + 1;
        iVar5 = iVar5 + local_b0._0_4_;
        iVar9 = iVar9 + local_b0._0_4_;
        RVar16 = RVar16 + local_b0._0_4_;
        iVar14 = iVar14 + local_b0._0_4_;
        iVar4 = (int)local_b8;
        iVar8 = (int)local_c0;
      } while (iVar13 != iVar4);
    }
    local_f8 = 4;
    if (1 < iVar4) {
      iVar13 = (iVar8 + -2) * l;
      local_78 = (ulong)(uint)((int)local_78 * l);
      iVar14 = (iVar8 * 2 + -1) * l;
      iVar4 = iVar8 * l;
      iVar9 = (iVar8 * 2 + -2) * l;
      iVar5 = 1;
      do {
        if (1 < l) {
          uVar3 = 0;
          do {
            local_e8 = iVar13 + uVar3;
            local_e4 = iVar13 + uVar3 + 1;
            local_108 = (int)local_78 + uVar3;
            local_104 = (int)local_78 + 1 + uVar3;
            local_d8 = iVar9 + uVar3;
            local_d4 = iVar9 + 1 + uVar3;
            local_fc = iVar14 + uVar3;
            local_100 = iVar14 + 1 + uVar3;
            local_e0 = local_104;
            local_dc = local_108;
            local_d0 = local_100;
            local_cc = local_fc;
            uVar17 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
            if (uVar17 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x558,"ref_fixture_hex_brick_args_grid",(ulong)uVar17,"qua");
              return uVar17;
            }
            uVar3 = uVar3 + 1;
          } while (local_9c != uVar3);
        }
        iVar5 = iVar5 + 1;
        iVar14 = iVar14 + iVar4;
        local_78 = (ulong)(uint)((int)local_78 + iVar4);
        iVar9 = iVar9 + iVar4;
        iVar13 = iVar13 + iVar4;
        iVar8 = (int)local_c0;
      } while (iVar5 != (int)local_b8);
    }
    local_f8 = 7;
    if (1 < iVar8) {
      iVar5 = iVar8 * l;
      iVar13 = (iVar8 + 1) * l;
      iVar4 = 1;
      iVar14 = 0;
      RVar16 = l;
      do {
        if (0 < (int)local_58) {
          iVar8 = 0;
          do {
            local_108 = iVar14 + iVar8;
            local_104 = iVar14 + iVar8 + 1;
            local_fc = RVar16 + iVar8;
            local_100 = RVar16 + 1 + iVar8;
            local_d8 = iVar5 + iVar8;
            local_d4 = iVar5 + 1 + iVar8;
            local_cc = iVar13 + iVar8;
            local_d0 = iVar13 + 1 + iVar8;
            local_e8 = local_108;
            local_e4 = local_104;
            local_e0 = local_100;
            local_dc = local_fc;
            uVar3 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x564,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,"qua");
              return uVar3;
            }
            iVar8 = iVar8 + 1;
          } while ((int)local_58 != iVar8);
        }
        iVar4 = iVar4 + 1;
        RVar16 = RVar16 + l;
        iVar13 = iVar13 + l;
        iVar14 = iVar14 + l;
        iVar5 = iVar5 + l;
        iVar8 = (int)local_c0;
      } while (iVar4 != iVar8);
    }
    local_f8 = 5;
    pRVar12 = local_68;
    if (1 < iVar8) {
      iVar13 = iVar8 * l;
      iVar4 = (iVar8 + 1) * l;
      iVar14 = 1;
      iVar5 = 0;
      local_11c = 0;
      RVar16 = l;
      do {
        iVar8 = 1;
        local_80 = (REF_DBL)CONCAT44(local_80._4_4_,iVar4);
        local_88 = (REF_DBL)CONCAT44(local_88._4_4_,RVar16);
        local_b0 = (double)CONCAT44(local_b0._4_4_,iVar13);
        local_a8 = (double)CONCAT44(local_a8._4_4_,iVar5);
        while (iVar9 = (int)local_58, iVar9 + iVar8 < l) {
          local_108 = iVar9 + iVar5;
          local_104 = iVar9 + iVar5 + 1;
          local_fc = iVar9 + RVar16;
          local_100 = iVar9 + 1 + RVar16;
          local_d8 = iVar9 + iVar13;
          local_d4 = iVar9 + 1 + iVar13;
          local_cc = iVar9 + iVar4;
          local_d0 = iVar9 + 1 + iVar4;
          local_e8 = local_108;
          local_e4 = local_104;
          local_e0 = local_100;
          local_dc = local_fc;
          uVar3 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x570,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,"qua");
            local_11c = uVar3;
          }
          iVar5 = iVar5 + 1;
          iVar13 = iVar13 + 1;
          RVar16 = RVar16 + 1;
          iVar4 = iVar4 + 1;
          iVar8 = iVar8 + 1;
          pRVar12 = local_68;
          if (uVar3 != 0) {
            return local_11c;
          }
        }
        iVar14 = iVar14 + 1;
        iVar5 = local_a8._0_4_ + l;
        iVar13 = local_b0._0_4_ + l;
        RVar16 = local_88._0_4_ + l;
        iVar4 = local_80._0_4_ + l;
        iVar8 = (int)local_c0;
      } while (iVar14 != iVar8);
    }
    local_f8 = 6;
    if (1 < iVar8) {
      iVar14 = iVar8 * l * (int)local_48;
      iVar4 = (int)local_b8 + -2;
      iVar13 = iVar8 * l * iVar4;
      iVar5 = ((int)local_48 * iVar8 + 1) * l;
      iVar9 = (iVar4 * iVar8 + 1) * l;
      iVar4 = 1;
      do {
        if (1 < l) {
          uVar3 = 0;
          do {
            local_e8 = iVar13 + uVar3;
            local_e4 = iVar13 + uVar3 + 1;
            local_dc = iVar9 + uVar3;
            local_e0 = iVar9 + 1 + uVar3;
            local_104 = iVar14 + uVar3;
            local_108 = iVar14 + 1 + uVar3;
            local_100 = iVar5 + uVar3;
            local_fc = iVar5 + 1 + uVar3;
            local_d8 = local_104;
            local_d4 = local_108;
            local_d0 = local_fc;
            local_cc = local_100;
            uVar17 = ref_cell_add(local_98->cell[6],&local_108,&local_c4);
            if (uVar17 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x57c,"ref_fixture_hex_brick_args_grid",(ulong)uVar17,"qua");
              return uVar17;
            }
            uVar3 = uVar3 + 1;
          } while (local_9c != uVar3);
        }
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + l;
        iVar9 = iVar9 + l;
        iVar14 = iVar14 + l;
        iVar13 = iVar13 + l;
        iVar8 = (int)local_c0;
        pRVar12 = local_68;
      } while (iVar4 != iVar8);
    }
    uVar3 = ref_node_initialize_n_global(pRVar12,(long)(iVar8 * l * (int)local_b8));
    if (uVar3 == 0) {
      return 0;
    }
    uVar7 = 0x57f;
  }
  else {
    uVar3 = ref_node_initialize_n_global(pRVar12,(long)(m * l * iVar8));
    if (uVar3 == 0) {
      return 0;
    }
    uVar7 = 0x50a;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_hex_brick_args_grid",(ulong)uVar3,"init glob");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hex_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], cell;
  REF_INT quad[5];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &cell), "hex");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 5;
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 6;
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}